

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthPermute(uint *pOut,uint *pIn,int nVars,char *pPerm,int fReturnIn)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  ulong uVar5;
  uint *pOut_00;
  uint uVar6;
  
  uVar6 = 0;
  do {
    if (nVars < 2) break;
    bVar4 = false;
    uVar5 = 0;
    pOut_00 = pOut;
    do {
      cVar2 = pPerm[uVar5];
      cVar3 = pPerm[uVar5 + 1];
      uVar1 = uVar5 + 1;
      if (cVar2 == cVar3) {
        __assert_fail("pPerm[i] != pPerm[i+1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                      ,0xf1,
                      "void Kit_TruthPermute(unsigned int *, unsigned int *, int, char *, int)");
      }
      pOut = pOut_00;
      if (cVar3 < cVar2) {
        uVar6 = uVar6 + 1;
        pPerm[uVar5] = cVar3;
        pPerm[uVar5 + 1] = cVar2;
        Kit_TruthSwapAdjacentVars(pOut_00,pIn,nVars,(int)uVar5);
        bVar4 = true;
        pOut = pIn;
        pIn = pOut_00;
      }
      uVar5 = uVar1;
      pOut_00 = pOut;
    } while (nVars - 1 != uVar1);
  } while (bVar4);
  if ((uVar6 & 1 ^ fReturnIn) != 1) {
    uVar6 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar6 = 1;
    }
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6 + 1;
      do {
        pOut[uVar5 - 2] = pIn[uVar5 - 2];
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  return;
}

Assistant:

void Kit_TruthPermute( unsigned * pOut, unsigned * pIn, int nVars, char * pPerm, int fReturnIn )
{
    unsigned * pTemp;
    int i, Temp, fChange, Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            assert( pPerm[i] != pPerm[i+1] );
            if ( pPerm[i] <= pPerm[i+1] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pPerm[i];
            pPerm[i] = pPerm[i+1];
            pPerm[i+1] = Temp;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
}